

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_bfins_mem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 arg3;
  uint16_t uVar1;
  uint value;
  uint32_t uVar2;
  TCGv_i32 arg2;
  TCGv_i32 local_50;
  TCGv_i32 ofs;
  TCGv_i32 len;
  TCGv_i32 addr;
  TCGv_i32 src;
  int ext;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar1 = read_im16(env,s);
  value = (uint)uVar1;
  arg3 = tcg_ctx_00->cpu_dregs[(int)((int)value >> 0xc & 7)];
  arg2 = gen_lea(env,s,insn,7);
  if (arg2 == tcg_ctx_00->NULL_QREG) {
    gen_addr_fault(s);
  }
  else {
    if ((uVar1 & 0x20) == 0) {
      uVar2 = extract32(value,0,5);
      ofs = tcg_const_i32_m68k(tcg_ctx_00,uVar2);
    }
    else {
      ofs = tcg_ctx_00->cpu_dregs[(int)(value & 7)];
    }
    if ((uVar1 & 0x800) == 0) {
      uVar2 = extract32(value,6,5);
      local_50 = tcg_const_i32_m68k(tcg_ctx_00,uVar2);
    }
    else {
      local_50 = tcg_ctx_00->cpu_dregs[(int)((int)value >> 6 & 7)];
    }
    gen_helper_bfins_mem(tcg_ctx_00,QREG_CC_N,tcg_ctx_00->cpu_env,arg2,arg3,local_50,ofs);
    set_cc_op(s,CC_OP_LOGIC);
    if ((uVar1 & 0x20) == 0) {
      tcg_temp_free_i32(tcg_ctx_00,ofs);
    }
    if ((uVar1 & 0x800) == 0) {
      tcg_temp_free_i32(tcg_ctx_00,local_50);
    }
  }
  return;
}

Assistant:

DISAS_INSN(bfins_mem)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int ext = read_im16(env, s);
    TCGv src = DREG(ext, 12);
    TCGv addr, len, ofs;

    addr = gen_lea(env, s, insn, OS_UNSIZED);
    if (IS_NULL_QREG(addr)) {
        gen_addr_fault(s);
        return;
    }

    if (ext & 0x20) {
        len = DREG(ext, 0);
    } else {
        len = tcg_const_i32(tcg_ctx, extract32(ext, 0, 5));
    }
    if (ext & 0x800) {
        ofs = DREG(ext, 6);
    } else {
        ofs = tcg_const_i32(tcg_ctx, extract32(ext, 6, 5));
    }

    gen_helper_bfins_mem(tcg_ctx, QREG_CC_N, tcg_ctx->cpu_env, addr, src, ofs, len);
    set_cc_op(s, CC_OP_LOGIC);

    if (!(ext & 0x20)) {
        tcg_temp_free(tcg_ctx, len);
    }
    if (!(ext & 0x800)) {
        tcg_temp_free(tcg_ctx, ofs);
    }
}